

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

ImGuiOldColumns * ImGui::FindOrCreateColumns(ImGuiWindow *window,ImGuiID id)

{
  int iVar1;
  int iVar2;
  ImGuiOldColumns *pIVar3;
  ulong uVar4;
  ImGuiOldColumns *in_RAX;
  ImGuiOldColumns *pIVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  bool bVar11;
  undefined1 auStack_a8 [104];
  void *local_40;
  ImDrawListSplitter local_38;
  
  iVar1 = (window->ColumnsStorage).Size;
  uVar10 = (ulong)iVar1;
  bVar11 = 0 < (long)uVar10;
  if ((0 < (long)uVar10) && (in_RAX = (window->ColumnsStorage).Data, in_RAX->ID != id)) {
    uVar4 = 1;
    do {
      uVar8 = uVar4;
      if (uVar10 == uVar8) {
        bVar11 = uVar8 < uVar10;
        goto LAB_001999c1;
      }
      pIVar3 = in_RAX + 1;
      pIVar5 = in_RAX + 1;
      in_RAX = pIVar3;
      uVar4 = uVar8 + 1;
    } while (pIVar5->ID != id);
    bVar11 = uVar8 < uVar10;
  }
LAB_001999c1:
  if (!bVar11) {
    memset(auStack_a8,0,0x88);
    iVar2 = (window->ColumnsStorage).Capacity;
    if (iVar1 == iVar2) {
      if (iVar2 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar2 / 2 + iVar2;
      }
      iVar9 = iVar1 + 1;
      if (iVar1 + 1 < iVar7) {
        iVar9 = iVar7;
      }
      if (iVar2 < iVar9) {
        pIVar5 = (ImGuiOldColumns *)MemAlloc((long)iVar9 * 0x88);
        pIVar3 = (window->ColumnsStorage).Data;
        if (pIVar3 != (ImGuiOldColumns *)0x0) {
          memcpy(pIVar5,pIVar3,(long)(window->ColumnsStorage).Size * 0x88);
          MemFree((window->ColumnsStorage).Data);
        }
        (window->ColumnsStorage).Data = pIVar5;
        (window->ColumnsStorage).Capacity = iVar9;
      }
    }
    memcpy((window->ColumnsStorage).Data + (window->ColumnsStorage).Size,auStack_a8,0x88);
    (window->ColumnsStorage).Size = (window->ColumnsStorage).Size + 1;
    ImDrawListSplitter::ClearFreeMemory(&local_38);
    if (local_38._Channels.Data != (ImDrawChannel *)0x0) {
      MemFree(local_38._Channels.Data);
    }
    if (local_40 != (void *)0x0) {
      MemFree(local_40);
    }
    lVar6 = (long)(window->ColumnsStorage).Size;
    if (lVar6 < 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.h"
                    ,0x758,"T &ImVector<ImGuiOldColumns>::back() [T = ImGuiOldColumns]");
    }
    in_RAX = (window->ColumnsStorage).Data + lVar6 + -1;
    in_RAX->ID = id;
  }
  return in_RAX;
}

Assistant:

ImGuiOldColumns* ImGui::FindOrCreateColumns(ImGuiWindow* window, ImGuiID id)
{
    // We have few columns per window so for now we don't need bother much with turning this into a faster lookup.
    for (int n = 0; n < window->ColumnsStorage.Size; n++)
        if (window->ColumnsStorage[n].ID == id)
            return &window->ColumnsStorage[n];

    window->ColumnsStorage.push_back(ImGuiOldColumns());
    ImGuiOldColumns* columns = &window->ColumnsStorage.back();
    columns->ID = id;
    return columns;
}